

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O0

ExtPrivkey * __thiscall
cfd::core::KeyData::GetExtPrivkey(ExtPrivkey *__return_storage_ptr__,KeyData *this)

{
  KeyData *this_local;
  
  ExtPrivkey::ExtPrivkey(__return_storage_ptr__,&this->extprivkey_);
  return __return_storage_ptr__;
}

Assistant:

ExtPrivkey KeyData::GetExtPrivkey() const { return extprivkey_; }